

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void character_sleeps(tgestate_t *state,uint8_t routeindex,route_t *route)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = CONCAT71(in_register_00000031,routeindex) & 0xffffffff;
  set_roomdef(state,(&setup_room::interior_mask_data_source[0x2d].bounds.x1)[uVar1 * 2],
              (uint)(&setup_room::interior_mask_data_source[0x2d].bounds.y0)[uVar1 * 2],0x17);
  character_sit_sleep_common(state,(9 < routeindex) * '\x02' + '\x03',route);
  return;
}

Assistant:

void character_sleeps(tgestate_t *state,
                      uint8_t     routeindex,
                      route_t    *route)
{
  room_t room; /* was C */

  assert(state  != NULL);
  assert(routeindex >= routeindex_7_PRISONER_SLEEPS_1 &&
         routeindex <= routeindex_12_PRISONER_SLEEPS_3);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  /* Poke object. */
  set_roomdef(state,
              beds[routeindex - 7].room_index,
              beds[routeindex - 7].offset,
              interiorobject_OCCUPIED_BED);

  if (routeindex < routeindex_10_PRISONER_SLEEPS_1)
    room = room_3_HUT2RIGHT;
  else
    room = room_5_HUT3RIGHT;

  character_sit_sleep_common(state, room, route); // was fallthrough
}